

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTests.cpp
# Opt level: O0

void * testAlloc(int size)

{
  bool local_21;
  int *local_20;
  int *local_18;
  char *ptr;
  int size_local;
  
  testTotalMemoryAlloc = testTotalMemoryAlloc + 1;
  testTotalMemoryRequested = size + testTotalMemoryRequested;
  testTotalMemoryUsed = size + testTotalMemoryUsed;
  ptr._4_4_ = size;
  local_18 = (int *)operator_new__((long)(size + 0x80));
  if ((-1 < ptr._4_4_) && (local_18 != (int *)0x0)) {
    memset(local_18,0xee,0x80);
    *local_18 = ptr._4_4_;
    local_20 = local_18;
    local_21 = true;
    SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::insert
              (&activePoiners,(unsigned_long *)&local_20,&local_21);
    return local_18 + 0x20;
  }
  __assert_fail("!\"out of memory\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/UnitTests.cpp"
                ,0x68,"void *testAlloc(int)");
}

Assistant:

void* testAlloc(int size)
{
	testTotalMemoryAlloc++;
	testTotalMemoryRequested += size;
	testTotalMemoryUsed += size;

#ifdef ALLOC_TOP_DOWN
	char *ptr = (char*)VirtualAlloc(NULL, size + 128, MEM_COMMIT | MEM_TOP_DOWN, PAGE_READWRITE);
#else
	char *ptr = new char[size + 128];
#endif

	if(size < 0 || !ptr)
	{
		assert(!"out of memory");
		return 0;
	}

	memset(ptr, 0xee, 128);
	*(unsigned*)ptr = size;

	activePoiners.insert(uintptr_t(ptr), 1);

	return ptr + 128;
}